

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O1

int KINInit(void *kinmem,KINSysFn func,N_Vector tmpl)

{
  size_t __size;
  _generic_N_Vector_Ops *p_Var1;
  long lVar2;
  N_Vector p_Var3;
  void *pvVar4;
  N_Vector *pp_Var5;
  int iVar6;
  int error_code;
  char *msgfmt;
  sunindextype lrw1;
  sunindextype liw1;
  sunindextype local_40;
  sunindextype local_38;
  
  if (kinmem == (void *)0x0) {
    msgfmt = "kinsol_mem = NULL illegal.";
    iVar6 = -1;
    kinmem = (KINMem)0x0;
    error_code = -1;
    goto LAB_00108da0;
  }
  if (func == (KINSysFn)0x0) {
    msgfmt = "func = NULL illegal.";
  }
  else {
    p_Var1 = tmpl->ops;
    if ((((((p_Var1->nvclone != (_func_N_Vector_N_Vector *)0x0) &&
           (p_Var1->nvdestroy != (_func_void_N_Vector *)0x0)) &&
          (p_Var1->nvlinearsum != (_func_void_realtype_N_Vector_realtype_N_Vector_N_Vector *)0x0))
         && ((p_Var1->nvprod != (_func_void_N_Vector_N_Vector_N_Vector *)0x0 &&
             (p_Var1->nvdiv != (_func_void_N_Vector_N_Vector_N_Vector *)0x0)))) &&
        ((p_Var1->nvscale != (_func_void_realtype_N_Vector_N_Vector *)0x0 &&
         ((p_Var1->nvabs != (_func_void_N_Vector_N_Vector *)0x0 &&
          (p_Var1->nvinv != (_func_void_N_Vector_N_Vector *)0x0)))))) &&
       ((p_Var1->nvmaxnorm != (_func_realtype_N_Vector *)0x0 &&
        ((p_Var1->nvmin != (_func_realtype_N_Vector *)0x0 &&
         (p_Var1->nvwl2norm != (_func_realtype_N_Vector_N_Vector *)0x0)))))) {
      if (p_Var1->nvspace == (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
        *(undefined8 *)((long)kinmem + 0x1b0) = 0;
        *(undefined8 *)((long)kinmem + 0x1b8) = 0;
      }
      else {
        N_VSpace(tmpl,&local_40,&local_38);
        *(sunindextype *)((long)kinmem + 0x1b0) = local_40;
        *(sunindextype *)((long)kinmem + 0x1b8) = local_38;
      }
      p_Var3 = N_VClone(tmpl);
      *(N_Vector *)((long)kinmem + 0x108) = p_Var3;
      if (p_Var3 == (N_Vector)0x0) goto LAB_0010906f;
      p_Var3 = N_VClone(tmpl);
      *(N_Vector *)((long)kinmem + 0x110) = p_Var3;
      if (p_Var3 == (N_Vector)0x0) {
        p_Var3 = *(N_Vector *)((long)kinmem + 0x108);
      }
      else {
        p_Var3 = N_VClone(tmpl);
        *(N_Vector *)((long)kinmem + 0x130) = p_Var3;
        if (p_Var3 == (N_Vector)0x0) {
          N_VDestroy(*(N_Vector *)((long)kinmem + 0x108));
          p_Var3 = *(N_Vector *)((long)kinmem + 0x110);
        }
        else {
          p_Var3 = N_VClone(tmpl);
          *(N_Vector *)((long)kinmem + 0x140) = p_Var3;
          if (p_Var3 == (N_Vector)0x0) {
            N_VDestroy(*(N_Vector *)((long)kinmem + 0x108));
            N_VDestroy(*(N_Vector *)((long)kinmem + 0x110));
            p_Var3 = *(N_Vector *)((long)kinmem + 0x130);
          }
          else {
            p_Var3 = N_VClone(tmpl);
            *(N_Vector *)((long)kinmem + 0x148) = p_Var3;
            if (p_Var3 != (N_Vector)0x0) {
              *(long *)((long)kinmem + 0x1c8) =
                   *(long *)((long)kinmem + 0x1c8) + *(long *)((long)kinmem + 0x1b8) * 5;
              lVar2 = *(long *)((long)kinmem + 400);
              *(long *)((long)kinmem + 0x1c0) =
                   *(long *)((long)kinmem + 0x1c0) + *(long *)((long)kinmem + 0x1b0) * 5;
              if (lVar2 == 0) goto LAB_001092f3;
              __size = lVar2 * 8;
              pvVar4 = malloc(__size * lVar2);
              *(void **)((long)kinmem + 0x180) = pvVar4;
              if (pvVar4 == (void *)0x0) {
                KINProcessError((KINMem)kinmem,0,"KINSOL","KINAllocVectors",
                                "A memory request failed.");
                N_VDestroy(*(N_Vector *)((long)kinmem + 0x108));
                N_VDestroy(*(N_Vector *)((long)kinmem + 0x110));
                N_VDestroy(*(N_Vector *)((long)kinmem + 0x130));
                N_VDestroy(*(N_Vector *)((long)kinmem + 0x140));
                N_VDestroy(*(N_Vector *)((long)kinmem + 0x148));
                goto LAB_001092f3;
              }
              pvVar4 = malloc(__size);
              *(void **)((long)kinmem + 0x178) = pvVar4;
              if (pvVar4 == (void *)0x0) {
                KINProcessError((KINMem)kinmem,0,"KINSOL","KINAllocVectors",
                                "A memory request failed.");
                N_VDestroy(*(N_Vector *)((long)kinmem + 0x108));
                N_VDestroy(*(N_Vector *)((long)kinmem + 0x110));
                N_VDestroy(*(N_Vector *)((long)kinmem + 0x130));
                N_VDestroy(*(N_Vector *)((long)kinmem + 0x140));
                N_VDestroy(*(N_Vector *)((long)kinmem + 0x148));
                pvVar4 = *(void **)((long)kinmem + 0x180);
              }
              else {
                pvVar4 = malloc(lVar2 << 2);
                *(void **)((long)kinmem + 0x188) = pvVar4;
                if (pvVar4 == (void *)0x0) {
                  KINProcessError((KINMem)kinmem,0,"KINSOL","KINAllocVectors",
                                  "A memory request failed.");
                  N_VDestroy(*(N_Vector *)((long)kinmem + 0x108));
                  N_VDestroy(*(N_Vector *)((long)kinmem + 0x110));
                  N_VDestroy(*(N_Vector *)((long)kinmem + 0x130));
                  N_VDestroy(*(N_Vector *)((long)kinmem + 0x140));
                  N_VDestroy(*(N_Vector *)((long)kinmem + 0x148));
                  free(*(void **)((long)kinmem + 0x180));
                  pvVar4 = *(void **)((long)kinmem + 0x178);
                }
                else {
                  pvVar4 = malloc(__size + 8);
                  *(void **)((long)kinmem + 0x1a0) = pvVar4;
                  if (pvVar4 == (void *)0x0) {
                    KINProcessError((KINMem)kinmem,0,"KINSOL","KINAllocVectors",
                                    "A memory request failed.");
                    N_VDestroy(*(N_Vector *)((long)kinmem + 0x108));
                    N_VDestroy(*(N_Vector *)((long)kinmem + 0x110));
                    N_VDestroy(*(N_Vector *)((long)kinmem + 0x130));
                    N_VDestroy(*(N_Vector *)((long)kinmem + 0x140));
                    N_VDestroy(*(N_Vector *)((long)kinmem + 0x148));
                    free(*(void **)((long)kinmem + 0x180));
                    free(*(void **)((long)kinmem + 0x178));
                    pvVar4 = *(void **)((long)kinmem + 0x188);
                  }
                  else {
                    pvVar4 = malloc(__size + 8);
                    *(void **)((long)kinmem + 0x1a8) = pvVar4;
                    if (pvVar4 != (void *)0x0) {
                      p_Var3 = N_VClone(tmpl);
                      *(N_Vector *)((long)kinmem + 0x150) = p_Var3;
                      if (p_Var3 == (N_Vector)0x0) {
                        N_VDestroy(*(N_Vector *)((long)kinmem + 0x108));
                        N_VDestroy(*(N_Vector *)((long)kinmem + 0x110));
                        N_VDestroy(*(N_Vector *)((long)kinmem + 0x130));
                        N_VDestroy(*(N_Vector *)((long)kinmem + 0x140));
                        N_VDestroy(*(N_Vector *)((long)kinmem + 0x148));
                        free(*(void **)((long)kinmem + 0x180));
                        free(*(void **)((long)kinmem + 0x178));
                        free(*(void **)((long)kinmem + 0x188));
                        free(*(void **)((long)kinmem + 0x1a0));
                        free(*(void **)((long)kinmem + 0x1a8));
                        goto LAB_0010906f;
                      }
                      p_Var3 = N_VClone(tmpl);
                      *(N_Vector *)((long)kinmem + 0x158) = p_Var3;
                      if (p_Var3 == (N_Vector)0x0) {
                        N_VDestroy(*(N_Vector *)((long)kinmem + 0x108));
                        N_VDestroy(*(N_Vector *)((long)kinmem + 0x110));
                        N_VDestroy(*(N_Vector *)((long)kinmem + 0x130));
                        N_VDestroy(*(N_Vector *)((long)kinmem + 0x140));
                        N_VDestroy(*(N_Vector *)((long)kinmem + 0x148));
                        free(*(void **)((long)kinmem + 0x180));
                        free(*(void **)((long)kinmem + 0x178));
                        free(*(void **)((long)kinmem + 0x188));
                        free(*(void **)((long)kinmem + 0x1a0));
                        free(*(void **)((long)kinmem + 0x1a8));
                        p_Var3 = *(N_Vector *)((long)kinmem + 0x150);
                      }
                      else {
                        pp_Var5 = N_VCloneVectorArray(*(int *)((long)kinmem + 400),tmpl);
                        *(N_Vector **)((long)kinmem + 0x160) = pp_Var5;
                        if (pp_Var5 != (N_Vector *)0x0) {
                          pp_Var5 = N_VCloneVectorArray(*(int *)((long)kinmem + 400),tmpl);
                          *(N_Vector **)((long)kinmem + 0x168) = pp_Var5;
                          if (pp_Var5 == (N_Vector *)0x0) {
                            N_VDestroy(*(N_Vector *)((long)kinmem + 0x108));
                            N_VDestroy(*(N_Vector *)((long)kinmem + 0x110));
                            N_VDestroy(*(N_Vector *)((long)kinmem + 0x130));
                            N_VDestroy(*(N_Vector *)((long)kinmem + 0x140));
                            N_VDestroy(*(N_Vector *)((long)kinmem + 0x148));
                            free(*(void **)((long)kinmem + 0x180));
                            free(*(void **)((long)kinmem + 0x178));
                            free(*(void **)((long)kinmem + 0x188));
                            free(*(void **)((long)kinmem + 0x1a0));
                            free(*(void **)((long)kinmem + 0x1a8));
                            N_VDestroy(*(N_Vector *)((long)kinmem + 0x150));
                            N_VDestroy(*(N_Vector *)((long)kinmem + 0x158));
                            pp_Var5 = *(N_Vector **)((long)kinmem + 0x160);
                          }
                          else {
                            lVar2 = *(long *)((long)kinmem + 400) * 2;
                            *(long *)((long)kinmem + 0x1c8) =
                                 *(long *)((long)kinmem + 0x1b8) * lVar2 +
                                 *(long *)((long)kinmem + 0x1c8) + 2;
                            *(long *)((long)kinmem + 0x1c0) =
                                 *(long *)((long)kinmem + 0x1c0) +
                                 lVar2 * *(long *)((long)kinmem + 0x1b0) + 2;
                            if (*(int *)((long)kinmem + 0x198) == 0) goto LAB_001092f3;
                            pp_Var5 = N_VCloneVectorArray((int)*(long *)((long)kinmem + 400),tmpl);
                            *(N_Vector **)((long)kinmem + 0x170) = pp_Var5;
                            if (pp_Var5 != (N_Vector *)0x0) {
                              *(long *)((long)kinmem + 0x1c8) =
                                   *(long *)((long)kinmem + 0x1c8) +
                                   *(long *)((long)kinmem + 0x1b8) * *(long *)((long)kinmem + 400);
                              *(long *)((long)kinmem + 0x1c0) =
                                   *(long *)((long)kinmem + 0x1c0) +
                                   *(long *)((long)kinmem + 400) * *(long *)((long)kinmem + 0x1b0);
                              goto LAB_001092f3;
                            }
                            N_VDestroy(*(N_Vector *)((long)kinmem + 0x108));
                            N_VDestroy(*(N_Vector *)((long)kinmem + 0x110));
                            N_VDestroy(*(N_Vector *)((long)kinmem + 0x130));
                            N_VDestroy(*(N_Vector *)((long)kinmem + 0x140));
                            N_VDestroy(*(N_Vector *)((long)kinmem + 0x148));
                            free(*(void **)((long)kinmem + 0x180));
                            free(*(void **)((long)kinmem + 0x178));
                            free(*(void **)((long)kinmem + 0x188));
                            free(*(void **)((long)kinmem + 0x1a0));
                            free(*(void **)((long)kinmem + 0x1a8));
                            N_VDestroy(*(N_Vector *)((long)kinmem + 0x150));
                            N_VDestroy(*(N_Vector *)((long)kinmem + 0x158));
                            N_VDestroyVectorArray
                                      (*(N_Vector **)((long)kinmem + 0x160),
                                       *(int *)((long)kinmem + 400));
                            pp_Var5 = *(N_Vector **)((long)kinmem + 0x168);
                          }
                          N_VDestroyVectorArray(pp_Var5,*(int *)((long)kinmem + 400));
                          goto LAB_0010906f;
                        }
                        N_VDestroy(*(N_Vector *)((long)kinmem + 0x108));
                        N_VDestroy(*(N_Vector *)((long)kinmem + 0x110));
                        N_VDestroy(*(N_Vector *)((long)kinmem + 0x130));
                        N_VDestroy(*(N_Vector *)((long)kinmem + 0x140));
                        N_VDestroy(*(N_Vector *)((long)kinmem + 0x148));
                        free(*(void **)((long)kinmem + 0x180));
                        free(*(void **)((long)kinmem + 0x178));
                        free(*(void **)((long)kinmem + 0x188));
                        free(*(void **)((long)kinmem + 0x1a0));
                        free(*(void **)((long)kinmem + 0x1a8));
                        N_VDestroy(*(N_Vector *)((long)kinmem + 0x150));
                        p_Var3 = *(N_Vector *)((long)kinmem + 0x158);
                      }
                      goto LAB_0010906a;
                    }
                    KINProcessError((KINMem)kinmem,0,"KINSOL","KINAllocVectors",
                                    "A memory request failed.");
                    N_VDestroy(*(N_Vector *)((long)kinmem + 0x108));
                    N_VDestroy(*(N_Vector *)((long)kinmem + 0x110));
                    N_VDestroy(*(N_Vector *)((long)kinmem + 0x130));
                    N_VDestroy(*(N_Vector *)((long)kinmem + 0x140));
                    N_VDestroy(*(N_Vector *)((long)kinmem + 0x148));
                    free(*(void **)((long)kinmem + 0x180));
                    free(*(void **)((long)kinmem + 0x178));
                    free(*(void **)((long)kinmem + 0x188));
                    pvVar4 = *(void **)((long)kinmem + 0x1a0);
                  }
                }
              }
              free(pvVar4);
LAB_001092f3:
              *(KINSysFn *)((long)kinmem + 8) = func;
              *(undefined8 *)((long)kinmem + 0x1f8) = 0;
              *(undefined8 *)((long)kinmem + 0x1d0) = 0;
              *(undefined8 *)((long)kinmem + 0x1d8) = 0;
              *(undefined8 *)((long)kinmem + 0x1e0) = 0;
              *(undefined8 *)((long)kinmem + 0x1e8) = 0;
              *(undefined4 *)((long)kinmem + 0x248) = 1;
              return 0;
            }
            N_VDestroy(*(N_Vector *)((long)kinmem + 0x108));
            N_VDestroy(*(N_Vector *)((long)kinmem + 0x110));
            N_VDestroy(*(N_Vector *)((long)kinmem + 0x130));
            p_Var3 = *(N_Vector *)((long)kinmem + 0x140);
          }
        }
      }
LAB_0010906a:
      N_VDestroy(p_Var3);
LAB_0010906f:
      KINProcessError((KINMem)kinmem,-4,"KINSOL","KINInit","A memory request failed.");
      free(kinmem);
      return -4;
    }
    msgfmt = "A required vector operation is not implemented.";
  }
  iVar6 = -2;
  error_code = -2;
LAB_00108da0:
  KINProcessError((KINMem)kinmem,error_code,"KINSOL","KINInit",msgfmt);
  return iVar6;
}

Assistant:

int KINInit(void *kinmem, KINSysFn func, N_Vector tmpl)
{
  sunindextype liw1, lrw1;
  KINMem kin_mem;
  booleantype allocOK, nvectorOK;
  
  /* check kinmem */

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINInit", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }
  kin_mem = (KINMem) kinmem;

  if (func == NULL) {
    KINProcessError(kin_mem, KIN_ILL_INPUT, "KINSOL", "KINInit", MSG_FUNC_NULL);
    return(KIN_ILL_INPUT);
  }

  /* check if all required vector operations are implemented */

  nvectorOK = KINCheckNvector(tmpl);
  if (!nvectorOK) {
    KINProcessError(kin_mem, KIN_ILL_INPUT, "KINSOL", "KINInit", MSG_BAD_NVECTOR);
    return(KIN_ILL_INPUT);
  }

  /* set space requirements for one N_Vector */

  if (tmpl->ops->nvspace != NULL) {
    N_VSpace(tmpl, &lrw1, &liw1);
    kin_mem->kin_lrw1 = lrw1;
    kin_mem->kin_liw1 = liw1;
  }
  else {
    kin_mem->kin_lrw1 = 0;
    kin_mem->kin_liw1 = 0;
  }

  /* allocate necessary vectors */

  allocOK = KINAllocVectors(kin_mem, tmpl);
  if (!allocOK) {
    KINProcessError(kin_mem, KIN_MEM_FAIL, "KINSOL", "KINInit", MSG_MEM_FAIL);
    free(kin_mem); kin_mem = NULL;
    return(KIN_MEM_FAIL);
  }

  /* copy the input parameter into KINSol state */

  kin_mem->kin_func = func;

  /* set the linear solver addresses to NULL */

  kin_mem->kin_linit  = NULL;
  kin_mem->kin_lsetup = NULL;
  kin_mem->kin_lsolve = NULL;
  kin_mem->kin_lfree  = NULL;
  kin_mem->kin_lmem   = NULL;
  
  /* problem memory has been successfully allocated */

  kin_mem->kin_MallocDone = SUNTRUE;

  return(KIN_SUCCESS);
}